

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database.cpp
# Opt level: O0

string * __thiscall
groundupdbext::EmbeddedDatabase::Impl::getDirectory_abi_cxx11_
          (string *__return_storage_ptr__,Impl *this)

{
  Impl *this_local;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->m_fullpath);
  return __return_storage_ptr__;
}

Assistant:

std::string EmbeddedDatabase::Impl::getDirectory() {
  return m_fullpath;
}